

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::RenderingContext::initGLFunctions(RenderingContext *this,Functions *gl)

{
  EglTestContext *this_00;
  EGLint local_3c;
  EGLint minorVersion;
  EGLint majorVersion;
  char *extensions [1];
  
  extensions[0] = "GL_KHR_robustness";
  this_00 = this->m_eglTestCtx;
  majorVersion = 1;
  minorVersion = 0;
  parseAttributeValues(this->m_attribList,&majorVersion,&minorVersion,&local_3c);
  EglTestContext::initGLFunctions
            (this_00,gl,(ApiType)((minorVersion << 4 | majorVersion) & 0x3ff),1,extensions);
  return;
}

Assistant:

void RenderingContext::initGLFunctions (glw::Functions *gl)
{
	const char* extensions[] = { "GL_KHR_robustness" };
	m_eglTestCtx.initGLFunctions(gl, attribListToContextType(m_attribList).getAPI(), DE_LENGTH_OF_ARRAY(extensions), &extensions[0]);
}